

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O1

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  seqDef **ppsVar3;
  ulong *puVar4;
  ulong *puVar5;
  int *piVar6;
  long *plVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  U32 *pUVar11;
  BYTE *pBVar12;
  seqDef *psVar13;
  char cVar14;
  uint uVar15;
  BYTE *op_1;
  ulong *puVar16;
  ulong uVar17;
  BYTE *pBVar18;
  byte bVar19;
  ulong uVar20;
  U32 UVar21;
  ulong uVar22;
  long *plVar23;
  uint uVar24;
  uint uVar25;
  long *plVar26;
  ulong *puVar27;
  ulong uVar28;
  ulong *puVar29;
  long *plVar30;
  BYTE *pInLoopLimit;
  uint uVar31;
  BYTE *op_4;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  BYTE *pBVar35;
  ulong uVar36;
  long lVar37;
  int local_c0;
  BYTE *base;
  BYTE *iend;
  BYTE *ilimit;
  U32 *hashTable;
  BYTE *lowest;
  U32 lowestIndex;
  
  uVar25 = cParams->searchLength;
  uVar20 = (ulong)cParams->targetLength;
  pUVar11 = ms->hashTable;
  pBVar12 = (ms->window).base;
  uVar8 = (ms->window).dictLimit;
  pBVar35 = pBVar12 + uVar8;
  uVar9 = rep[1];
  plVar26 = (long *)((ulong)(pBVar35 == (BYTE *)src) + (long)src);
  uVar31 = (int)plVar26 - (int)pBVar35;
  uVar32 = 0;
  uVar34 = (ulong)uVar9;
  if (uVar31 < uVar9) {
    uVar34 = uVar32;
  }
  uVar15 = (uint)uVar34;
  puVar5 = (ulong *)((long)src + srcSize);
  plVar7 = (long *)((long)src + (srcSize - 8));
  uVar10 = *rep;
  if (uVar10 <= uVar31) {
    uVar32 = (ulong)uVar10;
  }
  uVar24 = (uint)uVar32;
  local_c0 = (int)pBVar12;
  cVar14 = (char)cParams->hashLog;
  if (uVar25 == 5) {
    if (plVar26 < plVar7) {
      bVar19 = 0x40 - cVar14;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar16 = (ulong *)((long)puVar5 - 1);
      ppsVar3 = &seqStore->sequences;
      do {
        uVar22 = (ulong)(*plVar26 * -0x30e4432345000000) >> (bVar19 & 0x3f);
        uVar28 = (long)plVar26 - (long)pBVar12;
        uVar25 = pUVar11[uVar22];
        UVar21 = (U32)uVar28;
        pUVar11[uVar22] = UVar21;
        if (((int)uVar32 == 0) ||
           (plVar30 = (long *)((long)plVar26 + 1),
           *(int *)((long)plVar30 - uVar32) != *(int *)((long)plVar26 + 1))) {
          if ((uVar8 < uVar25) && (piVar6 = (int *)(pBVar12 + uVar25), *piVar6 == (int)*plVar26)) {
            puVar4 = (ulong *)((long)plVar26 + 4);
            puVar29 = (ulong *)(piVar6 + 1);
            puVar27 = puVar4;
            if (puVar4 < puVar1) {
              uVar22 = *puVar4 ^ *puVar29;
              uVar34 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                }
              }
              uVar34 = uVar34 >> 3 & 0x1fffffff;
              if (*puVar29 == *puVar4) {
                puVar27 = (ulong *)((long)plVar26 + 0xc);
                puVar29 = (ulong *)(piVar6 + 3);
                do {
                  if (puVar1 <= puVar27) goto LAB_00165f33;
                  uVar22 = *puVar29;
                  uVar17 = *puVar27;
                  uVar36 = uVar17 ^ uVar22;
                  uVar34 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                    }
                  }
                  uVar34 = (long)puVar27 + ((uVar34 >> 3 & 0x1fffffff) - (long)puVar4);
                  puVar27 = puVar27 + 1;
                  puVar29 = puVar29 + 1;
                } while (uVar22 == uVar17);
              }
            }
            else {
LAB_00165f33:
              if ((puVar27 < puVar2) && ((int)*puVar29 == (int)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 4);
                puVar29 = (ulong *)((long)puVar29 + 4);
              }
              if ((puVar27 < puVar16) && ((short)*puVar29 == (short)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 2);
                puVar29 = (ulong *)((long)puVar29 + 2);
              }
              if (puVar27 < puVar5) {
                puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar29 == (char)*puVar27));
              }
              uVar34 = (long)puVar27 - (long)puVar4;
            }
            lVar37 = uVar34 + 4;
            plVar30 = plVar26;
            if ((uVar8 < uVar25) && (src < plVar26)) {
              pBVar18 = pBVar12 + ((ulong)uVar25 - 1);
              do {
                plVar23 = (long *)((long)plVar30 + -1);
                if ((*(BYTE *)plVar23 != *pBVar18) ||
                   (lVar37 = lVar37 + 1, plVar30 = plVar23, pBVar18 <= pBVar35)) break;
                pBVar18 = pBVar18 + -1;
              } while (src < plVar23);
            }
            base._0_4_ = (int)piVar6;
            uVar25 = (int)plVar26 - (int)base;
            uVar34 = (long)plVar30 - (long)src;
            plVar23 = (long *)seqStore->lit;
            plVar26 = (long *)((long)plVar23 + uVar34);
            do {
              *plVar23 = *src;
              plVar23 = plVar23 + 1;
              src = (void *)((long)src + 8);
            } while (plVar23 < plVar26);
            seqStore->lit = seqStore->lit + uVar34;
            if (0xffff < uVar34) {
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            uVar22 = lVar37 - 3;
            psVar13 = *ppsVar3;
            psVar13->litLength = (U16)uVar34;
            psVar13->offset = uVar25 + 3;
            uVar34 = uVar32;
            uVar32 = (ulong)uVar25;
            goto joined_r0x00166031;
          }
          plVar26 = (long *)((long)plVar26 + ((long)plVar26 - (long)src >> 8) + uVar20);
        }
        else {
          puVar4 = (ulong *)((long)plVar26 + 5);
          puVar29 = (ulong *)((long)plVar26 + (5 - uVar32));
          puVar27 = puVar4;
          if (puVar4 < puVar1) {
            uVar17 = *puVar4 ^ *puVar29;
            uVar22 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
              }
            }
            uVar22 = uVar22 >> 3 & 0x1fffffff;
            if (*puVar29 == *puVar4) {
              puVar27 = (ulong *)((long)plVar26 + 0xd);
              puVar29 = (ulong *)((long)plVar26 + (0xd - uVar32));
              do {
                if (puVar1 <= puVar27) goto LAB_00165c89;
                uVar17 = *puVar29;
                uVar36 = *puVar27;
                uVar33 = uVar36 ^ uVar17;
                uVar22 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = (long)puVar27 + ((uVar22 >> 3 & 0x1fffffff) - (long)puVar4);
                puVar27 = puVar27 + 1;
                puVar29 = puVar29 + 1;
              } while (uVar17 == uVar36);
            }
          }
          else {
LAB_00165c89:
            if ((puVar27 < puVar2) && ((int)*puVar29 == (int)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 4);
              puVar29 = (ulong *)((long)puVar29 + 4);
            }
            if ((puVar27 < puVar16) && ((short)*puVar29 == (short)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 2);
              puVar29 = (ulong *)((long)puVar29 + 2);
            }
            if (puVar27 < puVar5) {
              puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar29 == (char)*puVar27));
            }
            uVar22 = (long)puVar27 - (long)puVar4;
          }
          uVar17 = (long)plVar30 - (long)src;
          plVar23 = (long *)seqStore->lit;
          plVar26 = (long *)((long)plVar23 + uVar17);
          do {
            *plVar23 = *src;
            plVar23 = plVar23 + 1;
            src = (void *)((long)src + 8);
          } while (plVar23 < plVar26);
          seqStore->lit = seqStore->lit + uVar17;
          if (0xffff < uVar17) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          lVar37 = uVar22 + 4;
          uVar22 = uVar22 + 1;
          psVar13 = *ppsVar3;
          psVar13->litLength = (U16)uVar17;
          psVar13->offset = 1;
joined_r0x00166031:
          if (0xffff < uVar22) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
          }
          plVar26 = (long *)(lVar37 + (long)plVar30);
          psVar13->matchLength = (U16)uVar22;
          *ppsVar3 = psVar13 + 1;
          src = plVar26;
          if (plVar26 <= plVar7) {
            pUVar11[(ulong)(*(long *)(pBVar12 + (uVar28 & 0xffffffff) + 2) * -0x30e4432345000000) >>
                    (bVar19 & 0x3f)] = UVar21 + 2;
            pUVar11[(ulong)(*(long *)((long)plVar26 + -2) * -0x30e4432345000000) >> (bVar19 & 0x3f)]
                 = ((int)plVar26 + -2) - local_c0;
            do {
              uVar22 = uVar32;
              uVar32 = uVar22;
              src = plVar26;
              if (((int)uVar34 == 0) || ((int)*plVar26 != *(int *)((long)plVar26 - uVar34))) break;
              puVar4 = (ulong *)((long)plVar26 + 4);
              puVar29 = (ulong *)((long)plVar26 + (4 - uVar34));
              puVar27 = puVar4;
              if (puVar4 < puVar1) {
                uVar28 = *puVar4 ^ *puVar29;
                uVar32 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = uVar32 >> 3 & 0x1fffffff;
                if (*puVar29 == *puVar4) {
                  puVar27 = (ulong *)((long)plVar26 + 0xc);
                  puVar29 = (ulong *)((long)plVar26 + (0xc - uVar34));
                  do {
                    if (puVar1 <= puVar27) goto LAB_00165e4d;
                    uVar28 = *puVar29;
                    uVar17 = *puVar27;
                    uVar36 = uVar17 ^ uVar28;
                    uVar32 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                      }
                    }
                    uVar32 = (long)puVar27 + ((uVar32 >> 3 & 0x1fffffff) - (long)puVar4);
                    puVar27 = puVar27 + 1;
                    puVar29 = puVar29 + 1;
                  } while (uVar28 == uVar17);
                }
              }
              else {
LAB_00165e4d:
                if ((puVar27 < puVar2) && ((int)*puVar29 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar29 = (ulong *)((long)puVar29 + 4);
                }
                if ((puVar27 < puVar16) && ((short)*puVar29 == (short)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar29 = (ulong *)((long)puVar29 + 2);
                }
                if (puVar27 < puVar5) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar29 == (char)*puVar27));
                }
                uVar32 = (long)puVar27 - (long)puVar4;
              }
              pUVar11[(ulong)(*plVar26 * -0x30e4432345000000) >> (bVar19 & 0x3f)] =
                   (int)plVar26 - local_c0;
              *(long *)seqStore->lit = *plVar26;
              psVar13 = seqStore->sequences;
              psVar13->litLength = 0;
              psVar13->offset = 1;
              if (0xffff < uVar32 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar13->matchLength = (U16)(uVar32 + 1);
              seqStore->sequences = psVar13 + 1;
              plVar26 = (long *)((long)plVar26 + uVar32 + 4);
              uVar32 = uVar34;
              uVar34 = uVar22;
              src = plVar26;
            } while (plVar26 <= plVar7);
          }
        }
        uVar15 = (uint)uVar34;
        uVar24 = (uint)uVar32;
      } while (plVar26 < plVar7);
    }
  }
  else if (uVar25 == 6) {
    if (plVar26 < plVar7) {
      bVar19 = 0x40 - cVar14;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar16 = (ulong *)((long)puVar5 - 1);
      ppsVar3 = &seqStore->sequences;
      do {
        uVar22 = (ulong)(*plVar26 * -0x30e4432340650000) >> (bVar19 & 0x3f);
        uVar28 = (long)plVar26 - (long)pBVar12;
        uVar25 = pUVar11[uVar22];
        UVar21 = (U32)uVar28;
        pUVar11[uVar22] = UVar21;
        if (((int)uVar32 == 0) ||
           (plVar30 = (long *)((long)plVar26 + 1),
           *(int *)((long)plVar30 - uVar32) != *(int *)((long)plVar26 + 1))) {
          if ((uVar8 < uVar25) && (piVar6 = (int *)(pBVar12 + uVar25), *piVar6 == (int)*plVar26)) {
            puVar4 = (ulong *)((long)plVar26 + 4);
            puVar29 = (ulong *)(piVar6 + 1);
            puVar27 = puVar4;
            if (puVar4 < puVar1) {
              uVar22 = *puVar4 ^ *puVar29;
              uVar34 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                }
              }
              uVar34 = uVar34 >> 3 & 0x1fffffff;
              if (*puVar29 == *puVar4) {
                puVar27 = (ulong *)((long)plVar26 + 0xc);
                puVar29 = (ulong *)(piVar6 + 3);
                do {
                  if (puVar1 <= puVar27) goto LAB_001659a8;
                  uVar22 = *puVar29;
                  uVar17 = *puVar27;
                  uVar36 = uVar17 ^ uVar22;
                  uVar34 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                    }
                  }
                  uVar34 = (long)puVar27 + ((uVar34 >> 3 & 0x1fffffff) - (long)puVar4);
                  puVar27 = puVar27 + 1;
                  puVar29 = puVar29 + 1;
                } while (uVar22 == uVar17);
              }
            }
            else {
LAB_001659a8:
              if ((puVar27 < puVar2) && ((int)*puVar29 == (int)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 4);
                puVar29 = (ulong *)((long)puVar29 + 4);
              }
              if ((puVar27 < puVar16) && ((short)*puVar29 == (short)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 2);
                puVar29 = (ulong *)((long)puVar29 + 2);
              }
              if (puVar27 < puVar5) {
                puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar29 == (char)*puVar27));
              }
              uVar34 = (long)puVar27 - (long)puVar4;
            }
            lVar37 = uVar34 + 4;
            plVar30 = plVar26;
            if ((uVar8 < uVar25) && (src < plVar26)) {
              pBVar18 = pBVar12 + ((ulong)uVar25 - 1);
              do {
                plVar23 = (long *)((long)plVar30 + -1);
                if ((*(BYTE *)plVar23 != *pBVar18) ||
                   (lVar37 = lVar37 + 1, plVar30 = plVar23, pBVar18 <= pBVar35)) break;
                pBVar18 = pBVar18 + -1;
              } while (src < plVar23);
            }
            iend._0_4_ = (int)piVar6;
            uVar25 = (int)plVar26 - (int)iend;
            uVar34 = (long)plVar30 - (long)src;
            plVar23 = (long *)seqStore->lit;
            plVar26 = (long *)((long)plVar23 + uVar34);
            do {
              *plVar23 = *src;
              plVar23 = plVar23 + 1;
              src = (void *)((long)src + 8);
            } while (plVar23 < plVar26);
            seqStore->lit = seqStore->lit + uVar34;
            if (0xffff < uVar34) {
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            uVar22 = lVar37 - 3;
            psVar13 = *ppsVar3;
            psVar13->litLength = (U16)uVar34;
            psVar13->offset = uVar25 + 3;
            uVar34 = uVar32;
            uVar32 = (ulong)uVar25;
            goto joined_r0x00165aa5;
          }
          plVar26 = (long *)((long)plVar26 + ((long)plVar26 - (long)src >> 8) + uVar20);
        }
        else {
          puVar4 = (ulong *)((long)plVar26 + 5);
          puVar29 = (ulong *)((long)plVar26 + (5 - uVar32));
          puVar27 = puVar4;
          if (puVar4 < puVar1) {
            uVar17 = *puVar4 ^ *puVar29;
            uVar22 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
              }
            }
            uVar22 = uVar22 >> 3 & 0x1fffffff;
            if (*puVar29 == *puVar4) {
              puVar27 = (ulong *)((long)plVar26 + 0xd);
              puVar29 = (ulong *)((long)plVar26 + (0xd - uVar32));
              do {
                if (puVar1 <= puVar27) goto LAB_00165707;
                uVar17 = *puVar29;
                uVar36 = *puVar27;
                uVar33 = uVar36 ^ uVar17;
                uVar22 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = (long)puVar27 + ((uVar22 >> 3 & 0x1fffffff) - (long)puVar4);
                puVar27 = puVar27 + 1;
                puVar29 = puVar29 + 1;
              } while (uVar17 == uVar36);
            }
          }
          else {
LAB_00165707:
            if ((puVar27 < puVar2) && ((int)*puVar29 == (int)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 4);
              puVar29 = (ulong *)((long)puVar29 + 4);
            }
            if ((puVar27 < puVar16) && ((short)*puVar29 == (short)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 2);
              puVar29 = (ulong *)((long)puVar29 + 2);
            }
            if (puVar27 < puVar5) {
              puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar29 == (char)*puVar27));
            }
            uVar22 = (long)puVar27 - (long)puVar4;
          }
          uVar17 = (long)plVar30 - (long)src;
          plVar23 = (long *)seqStore->lit;
          plVar26 = (long *)((long)plVar23 + uVar17);
          do {
            *plVar23 = *src;
            plVar23 = plVar23 + 1;
            src = (void *)((long)src + 8);
          } while (plVar23 < plVar26);
          seqStore->lit = seqStore->lit + uVar17;
          if (0xffff < uVar17) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          lVar37 = uVar22 + 4;
          uVar22 = uVar22 + 1;
          psVar13 = *ppsVar3;
          psVar13->litLength = (U16)uVar17;
          psVar13->offset = 1;
joined_r0x00165aa5:
          if (0xffff < uVar22) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
          }
          plVar26 = (long *)(lVar37 + (long)plVar30);
          psVar13->matchLength = (U16)uVar22;
          *ppsVar3 = psVar13 + 1;
          src = plVar26;
          if (plVar26 <= plVar7) {
            pUVar11[(ulong)(*(long *)(pBVar12 + (uVar28 & 0xffffffff) + 2) * -0x30e4432340650000) >>
                    (bVar19 & 0x3f)] = UVar21 + 2;
            pUVar11[(ulong)(*(long *)((long)plVar26 + -2) * -0x30e4432340650000) >> (bVar19 & 0x3f)]
                 = ((int)plVar26 + -2) - local_c0;
            do {
              uVar22 = uVar32;
              uVar32 = uVar22;
              src = plVar26;
              if (((int)uVar34 == 0) || ((int)*plVar26 != *(int *)((long)plVar26 - uVar34))) break;
              puVar4 = (ulong *)((long)plVar26 + 4);
              puVar29 = (ulong *)((long)plVar26 + (4 - uVar34));
              puVar27 = puVar4;
              if (puVar4 < puVar1) {
                uVar28 = *puVar4 ^ *puVar29;
                uVar32 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = uVar32 >> 3 & 0x1fffffff;
                if (*puVar29 == *puVar4) {
                  puVar27 = (ulong *)((long)plVar26 + 0xc);
                  puVar29 = (ulong *)((long)plVar26 + (0xc - uVar34));
                  do {
                    if (puVar1 <= puVar27) goto LAB_001658c2;
                    uVar28 = *puVar29;
                    uVar17 = *puVar27;
                    uVar36 = uVar17 ^ uVar28;
                    uVar32 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                      }
                    }
                    uVar32 = (long)puVar27 + ((uVar32 >> 3 & 0x1fffffff) - (long)puVar4);
                    puVar27 = puVar27 + 1;
                    puVar29 = puVar29 + 1;
                  } while (uVar28 == uVar17);
                }
              }
              else {
LAB_001658c2:
                if ((puVar27 < puVar2) && ((int)*puVar29 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar29 = (ulong *)((long)puVar29 + 4);
                }
                if ((puVar27 < puVar16) && ((short)*puVar29 == (short)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar29 = (ulong *)((long)puVar29 + 2);
                }
                if (puVar27 < puVar5) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar29 == (char)*puVar27));
                }
                uVar32 = (long)puVar27 - (long)puVar4;
              }
              pUVar11[(ulong)(*plVar26 * -0x30e4432340650000) >> (bVar19 & 0x3f)] =
                   (int)plVar26 - local_c0;
              *(long *)seqStore->lit = *plVar26;
              psVar13 = seqStore->sequences;
              psVar13->litLength = 0;
              psVar13->offset = 1;
              if (0xffff < uVar32 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar13->matchLength = (U16)(uVar32 + 1);
              seqStore->sequences = psVar13 + 1;
              plVar26 = (long *)((long)plVar26 + uVar32 + 4);
              uVar32 = uVar34;
              uVar34 = uVar22;
              src = plVar26;
            } while (plVar26 <= plVar7);
          }
        }
        uVar15 = (uint)uVar34;
        uVar24 = (uint)uVar32;
      } while (plVar26 < plVar7);
    }
  }
  else if (uVar25 == 7) {
    if (plVar26 < plVar7) {
      bVar19 = 0x40 - cVar14;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar16 = (ulong *)((long)puVar5 - 1);
      ppsVar3 = &seqStore->sequences;
      do {
        uVar28 = (ulong)(*plVar26 * -0x30e44323405a9d00) >> (bVar19 & 0x3f);
        uVar22 = (long)plVar26 - (long)pBVar12;
        uVar25 = pUVar11[uVar28];
        UVar21 = (U32)uVar22;
        pUVar11[uVar28] = UVar21;
        if (((int)uVar32 == 0) ||
           (plVar30 = (long *)((long)plVar26 + 1),
           *(int *)((long)plVar30 - uVar32) != *(int *)((long)plVar26 + 1))) {
          if ((uVar8 < uVar25) && (piVar6 = (int *)(pBVar12 + uVar25), *piVar6 == (int)*plVar26)) {
            puVar4 = (ulong *)((long)plVar26 + 4);
            puVar29 = (ulong *)(piVar6 + 1);
            puVar27 = puVar4;
            if (puVar4 < puVar1) {
              uVar28 = *puVar4 ^ *puVar29;
              uVar34 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                }
              }
              uVar34 = uVar34 >> 3 & 0x1fffffff;
              if (*puVar29 == *puVar4) {
                puVar27 = (ulong *)((long)plVar26 + 0xc);
                puVar29 = (ulong *)(piVar6 + 3);
                do {
                  if (puVar1 <= puVar27) goto LAB_0016540f;
                  uVar28 = *puVar29;
                  uVar17 = *puVar27;
                  uVar36 = uVar17 ^ uVar28;
                  uVar34 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                    }
                  }
                  uVar34 = (long)puVar27 + ((uVar34 >> 3 & 0x1fffffff) - (long)puVar4);
                  puVar27 = puVar27 + 1;
                  puVar29 = puVar29 + 1;
                } while (uVar28 == uVar17);
              }
            }
            else {
LAB_0016540f:
              if ((puVar27 < puVar2) && ((int)*puVar29 == (int)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 4);
                puVar29 = (ulong *)((long)puVar29 + 4);
              }
              if ((puVar27 < puVar16) && ((short)*puVar29 == (short)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 2);
                puVar29 = (ulong *)((long)puVar29 + 2);
              }
              if (puVar27 < puVar5) {
                puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar29 == (char)*puVar27));
              }
              uVar34 = (long)puVar27 - (long)puVar4;
            }
            lVar37 = uVar34 + 4;
            plVar30 = plVar26;
            if ((uVar8 < uVar25) && (src < plVar26)) {
              pBVar18 = pBVar12 + ((ulong)uVar25 - 1);
              do {
                plVar23 = (long *)((long)plVar30 + -1);
                if ((*(BYTE *)plVar23 != *pBVar18) ||
                   (lVar37 = lVar37 + 1, plVar30 = plVar23, pBVar18 <= pBVar35)) break;
                pBVar18 = pBVar18 + -1;
              } while (src < plVar23);
            }
            uVar25 = (int)plVar26 - (int)piVar6;
            uVar34 = (long)plVar30 - (long)src;
            plVar23 = (long *)seqStore->lit;
            plVar26 = (long *)((long)plVar23 + uVar34);
            do {
              *plVar23 = *src;
              plVar23 = plVar23 + 1;
              src = (void *)((long)src + 8);
            } while (plVar23 < plVar26);
            seqStore->lit = seqStore->lit + uVar34;
            if (0xffff < uVar34) {
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            uVar28 = lVar37 - 3;
            psVar13 = *ppsVar3;
            psVar13->litLength = (U16)uVar34;
            psVar13->offset = uVar25 + 3;
            uVar34 = uVar32;
            uVar32 = (ulong)uVar25;
            goto joined_r0x0016551c;
          }
          plVar26 = (long *)((long)plVar26 + ((long)plVar26 - (long)src >> 8) + uVar20);
        }
        else {
          puVar4 = (ulong *)((long)plVar26 + 5);
          puVar29 = (ulong *)((long)plVar26 + (5 - uVar32));
          puVar27 = puVar4;
          if (puVar4 < puVar1) {
            uVar17 = *puVar4 ^ *puVar29;
            uVar28 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
              }
            }
            uVar28 = uVar28 >> 3 & 0x1fffffff;
            if (*puVar29 == *puVar4) {
              puVar27 = (ulong *)((long)plVar26 + 0xd);
              puVar29 = (ulong *)((long)plVar26 + (0xd - uVar32));
              do {
                if (puVar1 <= puVar27) goto LAB_0016516a;
                uVar17 = *puVar29;
                uVar36 = *puVar27;
                uVar33 = uVar36 ^ uVar17;
                uVar28 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar28 = (long)puVar27 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar4);
                puVar27 = puVar27 + 1;
                puVar29 = puVar29 + 1;
              } while (uVar17 == uVar36);
            }
          }
          else {
LAB_0016516a:
            if ((puVar27 < puVar2) && ((int)*puVar29 == (int)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 4);
              puVar29 = (ulong *)((long)puVar29 + 4);
            }
            if ((puVar27 < puVar16) && ((short)*puVar29 == (short)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 2);
              puVar29 = (ulong *)((long)puVar29 + 2);
            }
            if (puVar27 < puVar5) {
              puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar29 == (char)*puVar27));
            }
            uVar28 = (long)puVar27 - (long)puVar4;
          }
          uVar17 = (long)plVar30 - (long)src;
          plVar23 = (long *)seqStore->lit;
          plVar26 = (long *)((long)plVar23 + uVar17);
          do {
            *plVar23 = *src;
            plVar23 = plVar23 + 1;
            src = (void *)((long)src + 8);
          } while (plVar23 < plVar26);
          seqStore->lit = seqStore->lit + uVar17;
          if (0xffff < uVar17) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          lVar37 = uVar28 + 4;
          uVar28 = uVar28 + 1;
          psVar13 = *ppsVar3;
          psVar13->litLength = (U16)uVar17;
          psVar13->offset = 1;
joined_r0x0016551c:
          if (0xffff < uVar28) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
          }
          plVar26 = (long *)(lVar37 + (long)plVar30);
          psVar13->matchLength = (U16)uVar28;
          *ppsVar3 = psVar13 + 1;
          src = plVar26;
          if (plVar26 <= plVar7) {
            pUVar11[(ulong)(*(long *)(pBVar12 + (uVar22 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
                    (bVar19 & 0x3f)] = UVar21 + 2;
            pUVar11[(ulong)(*(long *)((long)plVar26 + -2) * -0x30e44323405a9d00) >> (bVar19 & 0x3f)]
                 = ((int)plVar26 + -2) - local_c0;
            do {
              uVar22 = uVar32;
              uVar32 = uVar22;
              src = plVar26;
              if (((int)uVar34 == 0) || ((int)*plVar26 != *(int *)((long)plVar26 - uVar34))) break;
              puVar4 = (ulong *)((long)plVar26 + 4);
              puVar29 = (ulong *)((long)plVar26 + (4 - uVar34));
              puVar27 = puVar4;
              if (puVar4 < puVar1) {
                uVar28 = *puVar4 ^ *puVar29;
                uVar32 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                uVar32 = uVar32 >> 3 & 0x1fffffff;
                if (*puVar29 == *puVar4) {
                  puVar27 = (ulong *)((long)plVar26 + 0xc);
                  puVar29 = (ulong *)((long)plVar26 + (0xc - uVar34));
                  do {
                    if (puVar1 <= puVar27) goto LAB_00165329;
                    uVar28 = *puVar29;
                    uVar17 = *puVar27;
                    uVar36 = uVar17 ^ uVar28;
                    uVar32 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                      }
                    }
                    uVar32 = (long)puVar27 + ((uVar32 >> 3 & 0x1fffffff) - (long)puVar4);
                    puVar27 = puVar27 + 1;
                    puVar29 = puVar29 + 1;
                  } while (uVar28 == uVar17);
                }
              }
              else {
LAB_00165329:
                if ((puVar27 < puVar2) && ((int)*puVar29 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar29 = (ulong *)((long)puVar29 + 4);
                }
                if ((puVar27 < puVar16) && ((short)*puVar29 == (short)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar29 = (ulong *)((long)puVar29 + 2);
                }
                if (puVar27 < puVar5) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar29 == (char)*puVar27));
                }
                uVar32 = (long)puVar27 - (long)puVar4;
              }
              pUVar11[(ulong)(*plVar26 * -0x30e44323405a9d00) >> (bVar19 & 0x3f)] =
                   (int)plVar26 - local_c0;
              *(long *)seqStore->lit = *plVar26;
              psVar13 = seqStore->sequences;
              psVar13->litLength = 0;
              psVar13->offset = 1;
              if (0xffff < uVar32 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar13->matchLength = (U16)(uVar32 + 1);
              seqStore->sequences = psVar13 + 1;
              plVar26 = (long *)((long)plVar26 + uVar32 + 4);
              uVar32 = uVar34;
              uVar34 = uVar22;
              src = plVar26;
            } while (plVar26 <= plVar7);
          }
        }
        uVar15 = (uint)uVar34;
        uVar24 = (uint)uVar32;
      } while (plVar26 < plVar7);
    }
  }
  else if (plVar26 < plVar7) {
    bVar19 = 0x20 - cVar14;
    puVar1 = (ulong *)((long)puVar5 - 7);
    puVar2 = (ulong *)((long)puVar5 - 3);
    puVar16 = (ulong *)((long)puVar5 - 1);
    ppsVar3 = &seqStore->sequences;
    do {
      uVar15 = (uint)((int)*plVar26 * -0x61c8864f) >> (bVar19 & 0x1f);
      uVar22 = (long)plVar26 - (long)pBVar12;
      uVar25 = pUVar11[uVar15];
      UVar21 = (U32)uVar22;
      pUVar11[uVar15] = UVar21;
      if (((int)uVar32 == 0) ||
         (plVar30 = (long *)((long)plVar26 + 1),
         *(int *)((long)plVar30 - uVar32) != *(int *)((long)plVar26 + 1))) {
        if ((uVar8 < uVar25) && (piVar6 = (int *)(pBVar12 + uVar25), *piVar6 == (int)*plVar26)) {
          puVar4 = (ulong *)((long)plVar26 + 4);
          puVar29 = (ulong *)(piVar6 + 1);
          puVar27 = puVar4;
          if (puVar4 < puVar1) {
            uVar28 = *puVar4 ^ *puVar29;
            uVar34 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
              }
            }
            uVar34 = uVar34 >> 3 & 0x1fffffff;
            if (*puVar29 == *puVar4) {
              puVar27 = (ulong *)((long)plVar26 + 0xc);
              puVar29 = (ulong *)(piVar6 + 3);
              do {
                if (puVar1 <= puVar27) goto LAB_0016649d;
                uVar28 = *puVar29;
                uVar17 = *puVar27;
                uVar36 = uVar17 ^ uVar28;
                uVar34 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                  }
                }
                uVar34 = (long)puVar27 + ((uVar34 >> 3 & 0x1fffffff) - (long)puVar4);
                puVar27 = puVar27 + 1;
                puVar29 = puVar29 + 1;
              } while (uVar28 == uVar17);
            }
          }
          else {
LAB_0016649d:
            if ((puVar27 < puVar2) && ((int)*puVar29 == (int)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 4);
              puVar29 = (ulong *)((long)puVar29 + 4);
            }
            if ((puVar27 < puVar16) && ((short)*puVar29 == (short)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 2);
              puVar29 = (ulong *)((long)puVar29 + 2);
            }
            if (puVar27 < puVar5) {
              puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar29 == (char)*puVar27));
            }
            uVar34 = (long)puVar27 - (long)puVar4;
          }
          lVar37 = uVar34 + 4;
          plVar30 = plVar26;
          if ((uVar8 < uVar25) && (src < plVar26)) {
            pBVar18 = pBVar12 + ((ulong)uVar25 - 1);
            do {
              plVar23 = (long *)((long)plVar30 + -1);
              if ((*(BYTE *)plVar23 != *pBVar18) ||
                 (lVar37 = lVar37 + 1, plVar30 = plVar23, pBVar18 <= pBVar35)) break;
              pBVar18 = pBVar18 + -1;
            } while (src < plVar23);
          }
          base._0_4_ = (int)piVar6;
          uVar25 = (int)plVar26 - (int)base;
          uVar34 = (long)plVar30 - (long)src;
          plVar23 = (long *)seqStore->lit;
          plVar26 = (long *)((long)plVar23 + uVar34);
          do {
            *plVar23 = *src;
            plVar23 = plVar23 + 1;
            src = (void *)((long)src + 8);
          } while (plVar23 < plVar26);
          seqStore->lit = seqStore->lit + uVar34;
          if (0xffff < uVar34) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          uVar28 = lVar37 - 3;
          psVar13 = *ppsVar3;
          psVar13->litLength = (U16)uVar34;
          psVar13->offset = uVar25 + 3;
          uVar34 = uVar32;
          uVar32 = (ulong)uVar25;
          goto joined_r0x0016659e;
        }
        plVar26 = (long *)((long)plVar26 + ((long)plVar26 - (long)src >> 8) + uVar20);
      }
      else {
        puVar4 = (ulong *)((long)plVar26 + 5);
        puVar29 = (ulong *)((long)plVar26 + (5 - uVar32));
        puVar27 = puVar4;
        if (puVar4 < puVar1) {
          uVar17 = *puVar4 ^ *puVar29;
          uVar28 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar28 = uVar28 >> 3 & 0x1fffffff;
          if (*puVar29 == *puVar4) {
            puVar27 = (ulong *)((long)plVar26 + 0xd);
            puVar29 = (ulong *)((long)plVar26 + (0xd - uVar32));
            do {
              if (puVar1 <= puVar27) goto LAB_001661ff;
              uVar17 = *puVar29;
              uVar36 = *puVar27;
              uVar33 = uVar36 ^ uVar17;
              uVar28 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              uVar28 = (long)puVar27 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar4);
              puVar27 = puVar27 + 1;
              puVar29 = puVar29 + 1;
            } while (uVar17 == uVar36);
          }
        }
        else {
LAB_001661ff:
          if ((puVar27 < puVar2) && ((int)*puVar29 == (int)*puVar27)) {
            puVar27 = (ulong *)((long)puVar27 + 4);
            puVar29 = (ulong *)((long)puVar29 + 4);
          }
          if ((puVar27 < puVar16) && ((short)*puVar29 == (short)*puVar27)) {
            puVar27 = (ulong *)((long)puVar27 + 2);
            puVar29 = (ulong *)((long)puVar29 + 2);
          }
          if (puVar27 < puVar5) {
            puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar29 == (char)*puVar27));
          }
          uVar28 = (long)puVar27 - (long)puVar4;
        }
        uVar17 = (long)plVar30 - (long)src;
        plVar23 = (long *)seqStore->lit;
        plVar26 = (long *)((long)plVar23 + uVar17);
        do {
          *plVar23 = *src;
          plVar23 = plVar23 + 1;
          src = (void *)((long)src + 8);
        } while (plVar23 < plVar26);
        seqStore->lit = seqStore->lit + uVar17;
        if (0xffff < uVar17) {
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        lVar37 = uVar28 + 4;
        uVar28 = uVar28 + 1;
        psVar13 = *ppsVar3;
        psVar13->litLength = (U16)uVar17;
        psVar13->offset = 1;
joined_r0x0016659e:
        if (0xffff < uVar28) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
        }
        plVar26 = (long *)(lVar37 + (long)plVar30);
        psVar13->matchLength = (U16)uVar28;
        *ppsVar3 = psVar13 + 1;
        src = plVar26;
        if (plVar26 <= plVar7) {
          pUVar11[(uint)(*(int *)(pBVar12 + (uVar22 & 0xffffffff) + 2) * -0x61c8864f) >>
                  (bVar19 & 0x1f)] = UVar21 + 2;
          pUVar11[(uint)(*(int *)((long)plVar26 + -2) * -0x61c8864f) >> (bVar19 & 0x1f)] =
               ((int)plVar26 + -2) - local_c0;
          do {
            uVar22 = uVar32;
            uVar32 = uVar22;
            src = plVar26;
            if (((int)uVar34 == 0) || ((int)*plVar26 != *(int *)((long)plVar26 - uVar34))) break;
            puVar4 = (ulong *)((long)plVar26 + 4);
            puVar29 = (ulong *)((long)plVar26 + (4 - uVar34));
            puVar27 = puVar4;
            if (puVar4 < puVar1) {
              uVar28 = *puVar4 ^ *puVar29;
              uVar32 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                }
              }
              uVar32 = uVar32 >> 3 & 0x1fffffff;
              if (*puVar29 == *puVar4) {
                puVar27 = (ulong *)((long)plVar26 + 0xc);
                puVar29 = (ulong *)((long)plVar26 + (0xc - uVar34));
                do {
                  if (puVar1 <= puVar27) goto LAB_001663b6;
                  uVar28 = *puVar29;
                  uVar17 = *puVar27;
                  uVar36 = uVar17 ^ uVar28;
                  uVar32 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                    }
                  }
                  uVar32 = (long)puVar27 + ((uVar32 >> 3 & 0x1fffffff) - (long)puVar4);
                  puVar27 = puVar27 + 1;
                  puVar29 = puVar29 + 1;
                } while (uVar28 == uVar17);
              }
            }
            else {
LAB_001663b6:
              if ((puVar27 < puVar2) && ((int)*puVar29 == (int)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 4);
                puVar29 = (ulong *)((long)puVar29 + 4);
              }
              if ((puVar27 < puVar16) && ((short)*puVar29 == (short)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 2);
                puVar29 = (ulong *)((long)puVar29 + 2);
              }
              if (puVar27 < puVar5) {
                puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar29 == (char)*puVar27));
              }
              uVar32 = (long)puVar27 - (long)puVar4;
            }
            pUVar11[(uint)((int)*plVar26 * -0x61c8864f) >> (bVar19 & 0x1f)] =
                 (int)plVar26 - local_c0;
            *(long *)seqStore->lit = *plVar26;
            psVar13 = seqStore->sequences;
            psVar13->litLength = 0;
            psVar13->offset = 1;
            if (0xffff < uVar32 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar13->matchLength = (U16)(uVar32 + 1);
            seqStore->sequences = psVar13 + 1;
            plVar26 = (long *)((long)plVar26 + uVar32 + 4);
            uVar32 = uVar34;
            uVar34 = uVar22;
            src = plVar26;
          } while (plVar26 <= plVar7);
        }
      }
      uVar15 = (uint)uVar34;
      uVar24 = (uint)uVar32;
    } while (plVar26 < plVar7);
  }
  uVar25 = 0;
  if (uVar31 < uVar9) {
    uVar25 = uVar9;
  }
  if (uVar31 < uVar10) {
    uVar25 = uVar10;
  }
  if (uVar24 == 0) {
    uVar24 = uVar25;
  }
  if (uVar15 != 0) {
    uVar25 = uVar15;
  }
  *rep = uVar24;
  rep[1] = uVar25;
  return (long)puVar5 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)
{
    U32 const hlog = cParams->hashLog;
    U32 const mls = cParams->searchLength;
    U32 const stepSize = cParams->targetLength;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, hlog, stepSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, hlog, stepSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, hlog, stepSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, hlog, stepSize, 7);
    }
}